

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  int iVar1;
  container_t *c;
  int newCardinality;
  container_t *container2;
  uint8_t newtypecode;
  container_t *pcStack_28;
  int oldCardinality;
  container_t *container;
  _Bool result;
  uint8_t typecode;
  int i;
  uint16_t hb;
  roaring_array_t *prStack_10;
  uint32_t val_local;
  roaring_bitmap_t *r_local;
  
  _result = (uint16_t)(val >> 0x10);
  i = val;
  prStack_10 = &r->high_low_container;
  container._4_4_ = ra_get_index(&r->high_low_container,_result);
  container._2_1_ = false;
  if (-1 < container._4_4_) {
    ra_unshare_container_at_index(prStack_10,(uint16_t)container._4_4_);
    pcStack_28 = ra_get_container_at_index
                           (prStack_10,(uint16_t)container._4_4_,(uint8_t *)((long)&container + 3));
    container2._4_4_ = container_get_cardinality(pcStack_28,container._3_1_);
    container2._3_1_ = container._3_1_;
    c = container_remove(pcStack_28,(uint16_t)i,container._3_1_,(uint8_t *)((long)&container2 + 3));
    if (c != pcStack_28) {
      container_free(pcStack_28,container._3_1_);
      ra_set_container_at_index(prStack_10,container._4_4_,c,container2._3_1_);
    }
    iVar1 = container_get_cardinality(c,container2._3_1_);
    if (iVar1 == 0) {
      ra_remove_at_index_and_free(prStack_10,container._4_4_);
    }
    else {
      ra_set_container_at_index(prStack_10,container._4_4_,c,container2._3_1_);
    }
    container._2_1_ = container2._4_4_ != iVar1;
  }
  return (_Bool)container._2_1_;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}